

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

basic_string_view<char,_std::char_traits<char>_> __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos,size_type n)

{
  size_type sVar1;
  out_of_range *this_00;
  const_pointer pcVar2;
  char *s;
  unsigned_long *puVar3;
  unsigned_long local_48 [3];
  size_type local_30;
  size_type n_local;
  size_type pos_local;
  basic_string_view<char,_std::char_traits<char>_> *this_local;
  
  local_30 = n;
  n_local = pos;
  pos_local = (size_type)this;
  sVar1 = size(this);
  if (sVar1 < pos) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"nonst::string_view::substr()");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pcVar2 = data(this);
  s = pcVar2 + n_local;
  sVar1 = size(this);
  local_48[0] = sVar1 - n_local;
  puVar3 = std::min<unsigned_long>(&local_30,local_48);
  basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&this_local,s,*puVar3);
  return _this_local;
}

Assistant:

substr(size_type pos = 0, size_type n = npos) const {
#if nssv_CONFIG_NO_EXCEPTIONS
			assert(pos <= size());
#else
			if (pos > size()) {
				throw std::out_of_range("nonst::string_view::substr()");
			}
#endif
			return basic_string_view(data() + pos, (std::min)(n, size() - pos));
		}